

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileBacktrace::Entry::Entry(Entry *this,cmListFileContext *lfc,Entry *up)

{
  cmListFileContext::cmListFileContext(&this->super_cmListFileContext,lfc);
  this->Up = up;
  this->RefCount = 0;
  if (up != (Entry *)0x0) {
    up->RefCount = up->RefCount + 1;
  }
  return;
}

Assistant:

Entry(cmListFileContext const& lfc, Entry* up)
    : cmListFileContext(lfc)
    , Up(up)
    , RefCount(0)
  {
    if (this->Up) {
      this->Up->Ref();
    }
  }